

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::ForLoopStatement::serializeTo(ForLoopStatement *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "initializers";
  name._M_len = 0xc;
  ASTSerializer::startArray(serializer,name);
  ppEVar1 = (this->initializers)._M_ptr;
  sVar2 = (this->initializers)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  if (this->stopExpr != (Expression *)0x0) {
    ASTSerializer::write(serializer,8,"stopExpr",(size_t)this->stopExpr);
  }
  name_00._M_str = "steps";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  ppEVar1 = (this->steps)._M_ptr;
  sVar2 = (this->steps)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  return;
}

Assistant:

void ForLoopStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("initializers");
    for (auto ini : initializers) {
        serializer.serialize(*ini);
    }
    serializer.endArray();

    if (stopExpr)
        serializer.write("stopExpr", *stopExpr);

    serializer.startArray("steps");
    for (auto step : steps) {
        serializer.serialize(*step);
    }
    serializer.endArray();

    serializer.write("body", body);
}